

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall wallet::SQLiteDatabase::Cleanup(SQLiteDatabase *this)

{
  long lVar1;
  int iVar2;
  Mutex *pszName;
  AnnotatedMixin<std::mutex> *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  string_view in_stack_00000030;
  int ret;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  Level in_stack_00000110;
  char **in_stack_00000120;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffa8;
  LogFlags in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (Mutex *)0x3252aa);
  (**(code **)((in_RDI->super_mutex).super___mutex_base._M_mutex.__align + 0x40))();
  pszName = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             );
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,in_RDI,(char *)pszName,
             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
  g_sqlite_count = g_sqlite_count + -1;
  if ((g_sqlite_count == 0) && (iVar2 = sqlite3_shutdown(), iVar2 != 0)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    sqlite3_errstr(iVar2);
    in_stack_ffffffffffffff68 = 2;
    LogPrintFormatInternal<char_const*>
              (in_stack_00000030,(string_view)in_stack_00000020,in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd0,in_stack_00000110,in_stack_00000018,in_stack_00000120);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SQLiteDatabase::Cleanup() noexcept
{
    AssertLockNotHeld(g_sqlite_mutex);

    Close();

    LOCK(g_sqlite_mutex);
    if (--g_sqlite_count == 0) {
        int ret = sqlite3_shutdown();
        if (ret != SQLITE_OK) {
            LogPrintf("SQLiteDatabase: Failed to shutdown SQLite: %s\n", sqlite3_errstr(ret));
        }
    }
}